

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase613::run(TestCase613 *this)

{
  bool bVar1;
  longlong local_480;
  char local_471;
  WiderType<Decay<char>,_Decay<long_long>_> local_470;
  longlong local_468;
  bool local_459;
  longlong lStack_458;
  bool _kj_shouldLog_13;
  char local_449;
  WiderType<Decay<char>,_Decay<long_long>_> local_448;
  longlong local_440;
  DebugExpression<long_long> local_438;
  undefined1 local_430 [8];
  DebugComparison<long_long,_long_long> _kjCondition_13;
  longlong local_400;
  WiderType<Decay<long_long>,_Decay<char>_> local_3f8;
  longlong local_3f0;
  bool local_3e2;
  char local_3e1;
  bool _kj_shouldLog_12;
  longlong lStack_3e0;
  WiderType<Decay<long_long>,_Decay<char>_> local_3d8;
  longlong local_3d0;
  DebugExpression<long_long> local_3c8;
  undefined1 local_3c0 [8];
  DebugComparison<long_long,_long_long> _kjCondition_12;
  char local_389;
  WiderType<Decay<char>,_Decay<long_long>_> local_388;
  char local_37a;
  bool local_379;
  longlong lStack_378;
  bool _kj_shouldLog_11;
  char local_369;
  WiderType<Decay<char>,_Decay<long_long>_> local_368;
  char local_35a;
  DebugExpression<char> local_359;
  undefined1 local_358 [8];
  DebugComparison<char,_long_long> _kjCondition_11;
  longlong local_328;
  WiderType<Decay<long_long>,_Decay<char>_> local_320;
  char local_313;
  bool local_312;
  char local_311;
  bool _kj_shouldLog_10;
  longlong lStack_310;
  WiderType<Decay<long_long>,_Decay<char>_> local_308;
  char local_2fa;
  DebugExpression<char> local_2f9;
  undefined1 local_2f8 [8];
  DebugComparison<char,_long_long> _kjCondition_10;
  WiderType<Decay<char>,_Decay<int>_> local_2c8;
  char local_2c2;
  bool local_2c1;
  int local_2c0;
  bool _kj_shouldLog_9;
  WiderType<Decay<char>,_Decay<int>_> local_2b8;
  char local_2b2;
  DebugExpression<char> local_2b1;
  undefined1 local_2b0 [8];
  DebugComparison<char,_int> _kjCondition_9;
  int local_288;
  WiderType<Decay<int>,_Decay<char>_> local_284;
  char local_27f;
  bool local_27e;
  char local_27d;
  int local_27c;
  bool _kj_shouldLog_8;
  WiderType<Decay<int>,_Decay<char>_> WStack_278;
  char local_272;
  DebugExpression<char> local_271;
  undefined1 local_270 [8];
  DebugComparison<char,_int> _kjCondition_8;
  WiderType<Decay<char>,_Decay<int>_> local_248;
  int local_244;
  bool local_23d;
  int local_23c;
  bool _kj_shouldLog_7;
  WiderType<Decay<char>,_Decay<int>_> local_234;
  int local_230;
  DebugExpression<int> local_22c;
  undefined1 local_228 [8];
  DebugComparison<int,_int> _kjCondition_7;
  int local_200;
  WiderType<Decay<int>,_Decay<char>_> local_1fc;
  int local_1f8;
  bool local_1f2;
  char local_1f1;
  int local_1f0;
  bool _kj_shouldLog_6;
  WiderType<Decay<int>,_Decay<char>_> WStack_1ec;
  int local_1e8;
  DebugExpression<int> local_1e4;
  undefined1 local_1e0 [8];
  DebugComparison<int,_int> _kjCondition_6;
  WiderType<Decay<int>,_Decay<int>_> local_1b8;
  int local_1b4;
  bool local_1ad;
  int local_1ac;
  int iStack_1a8;
  bool _kj_shouldLog_5;
  WiderType<Decay<int>,_Decay<int>_> local_1a4;
  int local_1a0;
  DebugExpression<int> local_19c;
  undefined1 local_198 [8];
  DebugComparison<int,_int> _kjCondition_5;
  WiderType<Decay<int>,_Decay<int>_> local_170;
  int local_16c;
  bool local_165;
  int local_164;
  int iStack_160;
  bool _kj_shouldLog_4;
  WiderType<Decay<int>,_Decay<int>_> local_15c;
  int local_158;
  DebugExpression<int> local_154;
  undefined1 local_150 [8];
  DebugComparison<int,_int> _kjCondition_4;
  WiderType<Decay<int>,_Decay<int>_> local_128;
  int local_124;
  bool local_11d;
  int local_11c;
  int iStack_118;
  bool _kj_shouldLog_3;
  WiderType<Decay<int>,_Decay<int>_> local_114;
  int local_110;
  DebugExpression<int> local_10c;
  undefined1 local_108 [8];
  DebugComparison<int,_int> _kjCondition_3;
  WiderType<Decay<int>,_Decay<int>_> local_e0;
  int local_dc;
  bool local_d5;
  int local_d4;
  int iStack_d0;
  bool _kj_shouldLog_2;
  WiderType<Decay<int>,_Decay<int>_> local_cc;
  int local_c8;
  DebugExpression<int> local_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_int> _kjCondition_2;
  WiderType<Decay<int>,_Decay<int>_> local_98;
  int local_94;
  bool local_8d;
  int local_8c;
  int iStack_88;
  bool _kj_shouldLog_1;
  WiderType<Decay<int>,_Decay<int>_> local_84;
  int local_80;
  DebugExpression<int> local_7c;
  undefined1 local_78 [8];
  DebugComparison<int,_int> _kjCondition_1;
  WiderType<Decay<int>,_Decay<int>_> local_50;
  int local_4c;
  bool local_45;
  int local_44;
  int iStack_40;
  bool _kj_shouldLog;
  WiderType<Decay<int>,_Decay<int>_> local_3c;
  int local_38;
  DebugExpression<int> local_34;
  undefined1 local_30 [8];
  DebugComparison<int,_int> _kjCondition;
  TestCase613 *this_local;
  
  local_38 = 5;
  _kjCondition._24_8_ = this;
  local_34 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
  iStack_40 = 5;
  local_44 = 9;
  local_3c = min<int,int>(&stack0xffffffffffffffc0,&local_44);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_30,&local_34,&local_3c)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    local_45 = kj::_::Debug::shouldLog(ERROR);
    while (local_45 != false) {
      local_4c = 5;
      _kjCondition_1._28_4_ = 5;
      _kjCondition_1.result = true;
      _kjCondition_1._25_3_ = 0;
      local_50 = min<int,int>((int *)&_kjCondition_1.field_0x1c,(int *)&_kjCondition_1.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x266,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(5, 9))\", _kjCondition, 5, kj::min(5, 9)",
                 (char (*) [40])"failed: expected (5) == (kj::min(5, 9))",
                 (DebugComparison<int,_int> *)local_30,&local_4c,&local_50);
      local_45 = false;
    }
  }
  local_80 = 5;
  local_7c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
  iStack_88 = 9;
  local_8c = 5;
  local_84 = min<int,int>(&stack0xffffffffffffff78,&local_8c);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_78,&local_7c,&local_84)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
  if (!bVar1) {
    local_8d = kj::_::Debug::shouldLog(ERROR);
    while (local_8d != false) {
      local_94 = 5;
      _kjCondition_2._28_4_ = 9;
      _kjCondition_2.result = true;
      _kjCondition_2._25_3_ = 0;
      local_98 = min<int,int>((int *)&_kjCondition_2.field_0x1c,(int *)&_kjCondition_2.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x267,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(9, 5))\", _kjCondition, 5, kj::min(9, 5)",
                 (char (*) [40])"failed: expected (5) == (kj::min(9, 5))",
                 (DebugComparison<int,_int> *)local_78,&local_94,&local_98);
      local_8d = false;
    }
  }
  local_c8 = 5;
  local_c4 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  iStack_d0 = 5;
  local_d4 = 5;
  local_cc = min<int,int>(&stack0xffffffffffffff30,&local_d4);
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_c0,&local_c4,&local_cc)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    local_d5 = kj::_::Debug::shouldLog(ERROR);
    while (local_d5 != false) {
      local_dc = 5;
      _kjCondition_3._28_4_ = 5;
      _kjCondition_3.result = true;
      _kjCondition_3._25_3_ = 0;
      local_e0 = min<int,int>((int *)&_kjCondition_3.field_0x1c,(int *)&_kjCondition_3.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x268,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(5, 5))\", _kjCondition, 5, kj::min(5, 5)",
                 (char (*) [40])"failed: expected (5) == (kj::min(5, 5))",
                 (DebugComparison<int,_int> *)local_c0,&local_dc,&local_e0);
      local_d5 = false;
    }
  }
  local_110 = 9;
  local_10c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_110);
  iStack_118 = 5;
  local_11c = 9;
  local_114 = max<int,int>(&stack0xfffffffffffffee8,&local_11c);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_108,&local_10c,&local_114);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
  if (!bVar1) {
    local_11d = kj::_::Debug::shouldLog(ERROR);
    while (local_11d != false) {
      local_124 = 9;
      _kjCondition_4._28_4_ = 5;
      _kjCondition_4.result = true;
      _kjCondition_4._25_3_ = 0;
      local_128 = max<int,int>((int *)&_kjCondition_4.field_0x1c,(int *)&_kjCondition_4.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x269,ERROR,
                 "\"failed: expected \" \"(9) == (kj::max(5, 9))\", _kjCondition, 9, kj::max(5, 9)",
                 (char (*) [40])"failed: expected (9) == (kj::max(5, 9))",
                 (DebugComparison<int,_int> *)local_108,&local_124,&local_128);
      local_11d = false;
    }
  }
  local_158 = 9;
  local_154 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_158);
  iStack_160 = 9;
  local_164 = 5;
  local_15c = max<int,int>(&stack0xfffffffffffffea0,&local_164);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_150,&local_154,&local_15c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
  if (!bVar1) {
    local_165 = kj::_::Debug::shouldLog(ERROR);
    while (local_165 != false) {
      local_16c = 9;
      _kjCondition_5._28_4_ = 9;
      _kjCondition_5.result = true;
      _kjCondition_5._25_3_ = 0;
      local_170 = max<int,int>((int *)&_kjCondition_5.field_0x1c,(int *)&_kjCondition_5.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x26a,ERROR,
                 "\"failed: expected \" \"(9) == (kj::max(9, 5))\", _kjCondition, 9, kj::max(9, 5)",
                 (char (*) [40])"failed: expected (9) == (kj::max(9, 5))",
                 (DebugComparison<int,_int> *)local_150,&local_16c,&local_170);
      local_165 = false;
    }
  }
  local_1a0 = 5;
  local_19c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a0);
  iStack_1a8 = 5;
  local_1ac = 5;
  local_1a4 = min<int,int>(&stack0xfffffffffffffe58,&local_1ac);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_198,&local_19c,&local_1a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  if (!bVar1) {
    local_1ad = kj::_::Debug::shouldLog(ERROR);
    while (local_1ad != false) {
      local_1b4 = 5;
      _kjCondition_6._28_4_ = 5;
      _kjCondition_6.result = true;
      _kjCondition_6._25_3_ = 0;
      local_1b8 = min<int,int>((int *)&_kjCondition_6.field_0x1c,(int *)&_kjCondition_6.result);
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x26b,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(5, 5))\", _kjCondition, 5, kj::min(5, 5)",
                 (char (*) [40])"failed: expected (5) == (kj::min(5, 5))",
                 (DebugComparison<int,_int> *)local_198,&local_1b4,&local_1b8);
      local_1ad = false;
    }
  }
  local_1e8 = 5;
  local_1e4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e8);
  local_1f0 = 5;
  local_1f1 = 'a';
  WStack_1ec = min<int,char>(&local_1f0,&local_1f1);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1e0,&local_1e4,&stack0xfffffffffffffe14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
  if (!bVar1) {
    local_1f2 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f2 != false) {
      local_1f8 = 5;
      local_200 = 5;
      _kjCondition_7._31_1_ = 0x61;
      local_1fc = min<int,char>(&local_200,&_kjCondition_7.field_0x1f);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x26e,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(5, \'a\'))\", _kjCondition, 5, kj::min(5, \'a\')"
                 ,(char (*) [42])"failed: expected (5) == (kj::min(5, \'a\'))",
                 (DebugComparison<int,_int> *)local_1e0,&local_1f8,&local_1fc);
      local_1f2 = false;
    }
  }
  local_230 = 5;
  local_22c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  _kj_shouldLog_7 = true;
  local_23c = 5;
  local_234 = min<char,int>(&_kj_shouldLog_7,&local_23c);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_228,&local_22c,&local_234);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    local_23d = kj::_::Debug::shouldLog(ERROR);
    while (local_23d != false) {
      local_244 = 5;
      _kjCondition_8._31_1_ = 0x61;
      _kjCondition_8.result = true;
      _kjCondition_8._25_3_ = 0;
      local_248 = min<char,int>(&_kjCondition_8.field_0x1f,(int *)&_kjCondition_8.result);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x26f,ERROR,
                 "\"failed: expected \" \"(5) == (kj::min(\'a\', 5))\", _kjCondition, 5, kj::min(\'a\', 5)"
                 ,(char (*) [42])"failed: expected (5) == (kj::min(\'a\', 5))",
                 (DebugComparison<int,_int> *)local_228,&local_244,&local_248);
      local_23d = false;
    }
  }
  local_272 = 'a';
  local_271 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_272);
  local_27c = 5;
  local_27d = 'a';
  WStack_278 = max<int,char>(&local_27c,&local_27d);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_int> *)local_270,&local_271,&stack0xfffffffffffffd88);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_270);
  if (!bVar1) {
    local_27e = kj::_::Debug::shouldLog(ERROR);
    while (local_27e != false) {
      local_27f = 'a';
      local_288 = 5;
      _kjCondition_9._31_1_ = 0x61;
      local_284 = max<int,char>(&local_288,&_kjCondition_9.field_0x1f);
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<char,int>&,char,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x270,ERROR,
                 "\"failed: expected \" \"(\'a\') == (kj::max(5, \'a\'))\", _kjCondition, \'a\', kj::max(5, \'a\')"
                 ,(char (*) [44])"failed: expected (\'a\') == (kj::max(5, \'a\'))",
                 (DebugComparison<char,_int> *)local_270,&local_27f,&local_284);
      local_27e = false;
    }
  }
  local_2b2 = 'a';
  local_2b1 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2b2);
  _kj_shouldLog_9 = true;
  local_2c0 = 5;
  local_2b8 = max<char,int>(&_kj_shouldLog_9,&local_2c0);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_int> *)local_2b0,&local_2b1,&local_2b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b0);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2c2 = 'a';
      _kjCondition_10._39_1_ = 0x61;
      _kjCondition_10.result = true;
      _kjCondition_10._33_3_ = 0;
      local_2c8 = max<char,int>(&_kjCondition_10.field_0x27,(int *)&_kjCondition_10.result);
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<char,int>&,char,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x271,ERROR,
                 "\"failed: expected \" \"(\'a\') == (kj::max(\'a\', 5))\", _kjCondition, \'a\', kj::max(\'a\', 5)"
                 ,(char (*) [44])"failed: expected (\'a\') == (kj::max(\'a\', 5))",
                 (DebugComparison<char,_int> *)local_2b0,&local_2c2,&local_2c8);
      local_2c1 = false;
    }
  }
  local_2fa = 'a';
  local_2f9 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2fa);
  lStack_310 = 0x112210f47de98115;
  local_311 = 'a';
  local_308 = min<long_long,char>(&stack0xfffffffffffffcf0,&local_311);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_long_long> *)local_2f8,&local_2f9,&local_308);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f8);
  if (!bVar1) {
    local_312 = kj::_::Debug::shouldLog(ERROR);
    while (local_312 != false) {
      local_313 = 'a';
      local_328 = 0x112210f47de98115;
      _kjCondition_11._39_1_ = 0x61;
      local_320 = min<long_long,char>(&local_328,&_kjCondition_11.field_0x27);
      kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<char,long_long>&,char,long_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x273,ERROR,
                 "\"failed: expected \" \"(\'a\') == (kj::min(1234567890123456789ll, \'a\'))\", _kjCondition, \'a\', kj::min(1234567890123456789ll, \'a\')"
                 ,(char (*) [64])
                  "failed: expected (\'a\') == (kj::min(1234567890123456789ll, \'a\'))",
                 (DebugComparison<char,_long_long> *)local_2f8,&local_313,&local_320);
      local_312 = false;
    }
  }
  local_35a = 'a';
  local_359 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_35a);
  local_369 = 'a';
  lStack_378 = 0x112210f47de98115;
  local_368 = min<char,long_long>(&local_369,&stack0xfffffffffffffc88);
  kj::_::DebugExpression<char>::operator==
            ((DebugComparison<char,_long_long> *)local_358,&local_359,&local_368);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_358);
  if (!bVar1) {
    local_379 = kj::_::Debug::shouldLog(ERROR);
    while (local_379 != false) {
      local_37a = 'a';
      local_389 = 'a';
      _kjCondition_12.result = true;
      _kjCondition_12._33_7_ = 0x112210f47de981;
      local_388 = min<char,long_long>(&local_389,(longlong *)&_kjCondition_12.result);
      kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<char,long_long>&,char,long_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x274,ERROR,
                 "\"failed: expected \" \"(\'a\') == (kj::min(\'a\', 1234567890123456789ll))\", _kjCondition, \'a\', kj::min(\'a\', 1234567890123456789ll)"
                 ,(char (*) [64])
                  "failed: expected (\'a\') == (kj::min(\'a\', 1234567890123456789ll))",
                 (DebugComparison<char,_long_long> *)local_358,&local_37a,&local_388);
      local_379 = false;
    }
  }
  local_3d0 = 0x112210f47de98115;
  local_3c8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3d0);
  lStack_3e0 = 0x112210f47de98115;
  local_3e1 = 'a';
  local_3d8 = max<long_long,char>(&stack0xfffffffffffffc20,&local_3e1);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long_long> *)local_3c0,&local_3c8,&local_3d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar1) {
    local_3e2 = kj::_::Debug::shouldLog(ERROR);
    while (local_3e2 != false) {
      local_3f0 = 0x112210f47de98115;
      local_400 = 0x112210f47de98115;
      _kjCondition_13._39_1_ = 0x61;
      local_3f8 = max<long_long,char>(&local_400,&_kjCondition_13.field_0x27);
      kj::_::Debug::
      log<char_const(&)[82],kj::_::DebugComparison<long_long,long_long>&,long_long,long_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x275,ERROR,
                 "\"failed: expected \" \"(1234567890123456789ll) == (kj::max(1234567890123456789ll, \'a\'))\", _kjCondition, 1234567890123456789ll, kj::max(1234567890123456789ll, \'a\')"
                 ,(char (*) [82])
                  "failed: expected (1234567890123456789ll) == (kj::max(1234567890123456789ll, \'a\'))"
                 ,(DebugComparison<long_long,_long_long> *)local_3c0,&local_3f0,&local_3f8);
      local_3e2 = false;
    }
  }
  local_440 = 0x112210f47de98115;
  local_438 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_440);
  local_449 = 'a';
  lStack_458 = 0x112210f47de98115;
  local_448 = max<char,long_long>(&local_449,&stack0xfffffffffffffba8);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long_long> *)local_430,&local_438,&local_448);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_430);
  if (!bVar1) {
    local_459 = kj::_::Debug::shouldLog(ERROR);
    while (local_459 != false) {
      local_468 = 0x112210f47de98115;
      local_471 = 'a';
      local_480 = 0x112210f47de98115;
      local_470 = max<char,long_long>(&local_471,&local_480);
      kj::_::Debug::
      log<char_const(&)[82],kj::_::DebugComparison<long_long,long_long>&,long_long,long_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x276,ERROR,
                 "\"failed: expected \" \"(1234567890123456789ll) == (kj::max(\'a\', 1234567890123456789ll))\", _kjCondition, 1234567890123456789ll, kj::max(\'a\', 1234567890123456789ll)"
                 ,(char (*) [82])
                  "failed: expected (1234567890123456789ll) == (kj::max(\'a\', 1234567890123456789ll))"
                 ,(DebugComparison<long_long,_long_long> *)local_430,&local_468,&local_470);
      local_459 = false;
    }
  }
  return;
}

Assistant:

TEST(Common, MinMax) {
  EXPECT_EQ(5, kj::min(5, 9));
  EXPECT_EQ(5, kj::min(9, 5));
  EXPECT_EQ(5, kj::min(5, 5));
  EXPECT_EQ(9, kj::max(5, 9));
  EXPECT_EQ(9, kj::max(9, 5));
  EXPECT_EQ(5, kj::min(5, 5));

  // Hey look, we can handle the types mismatching.  Eat your heart out, std.
  EXPECT_EQ(5, kj::min(5, 'a'));
  EXPECT_EQ(5, kj::min('a', 5));
  EXPECT_EQ('a', kj::max(5, 'a'));
  EXPECT_EQ('a', kj::max('a', 5));

  EXPECT_EQ('a', kj::min(1234567890123456789ll, 'a'));
  EXPECT_EQ('a', kj::min('a', 1234567890123456789ll));
  EXPECT_EQ(1234567890123456789ll, kj::max(1234567890123456789ll, 'a'));
  EXPECT_EQ(1234567890123456789ll, kj::max('a', 1234567890123456789ll));
}